

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

ArchExtKind __thiscall llvm::AArch64::parseArchExt(AArch64 *this,StringRef ArchExt)

{
  int iVar1;
  char *__n;
  long lVar2;
  
  __n = ArchExt.Data;
  lVar2 = 0x10;
  while ((*(char **)(&UNK_001cf0b8 + lVar2) != __n ||
         ((__n != (char *)0x0 &&
          (iVar1 = bcmp(this,*(void **)(&UNK_001cf0b0 + lVar2),(size_t)__n), iVar1 != 0))))) {
    lVar2 = lVar2 + 0x28;
    if (lVar2 == 0x2e0) {
      return AEK_INVALID;
    }
  }
  return *(ArchExtKind *)((long)&(anonymous_namespace)::AArch64ARCHExtNames + lVar2);
}

Assistant:

AArch64::ArchExtKind llvm::AArch64::parseArchExt(StringRef ArchExt) {
  for (const auto A : AArch64ARCHExtNames) {
    if (ArchExt == A.getName())
      return static_cast<ArchExtKind>(A.ID);
  }
  return AArch64::AEK_INVALID;
}